

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

wchar_t count_known_monsters(void)

{
  monster_race *pmVar1;
  monster_race *pmVar2;
  _Bool _Var3;
  ui_monster_category *puVar4;
  angband_constants *paVar5;
  wchar_t wVar6;
  uint uVar7;
  wchar_t wVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  
  if (z_info->r_max == 0) {
    wVar8 = L'\0';
  }
  else {
    uVar11 = 0;
    wVar8 = L'\0';
    paVar5 = z_info;
    do {
      pmVar2 = r_info;
      if (((l_list[uVar11].all_known != false) || (l_list[uVar11].sights != 0)) &&
         (r_info[uVar11].name != (char *)0x0)) {
        uVar7 = 1;
        if (L'\x01' < n_monster_group) {
          pmVar1 = r_info + uVar11;
          lVar9 = 0;
          bVar12 = 0;
          puVar4 = monster_group;
          wVar6 = n_monster_group;
          do {
            if (0 < (long)puVar4[lVar9].n_inc_bases) {
              lVar10 = 0;
              do {
                if (pmVar2[uVar11].base == puVar4[lVar9].inc_bases[lVar10]) {
                  wVar8 = wVar8 + L'\x01';
                  bVar12 = 1;
                  goto LAB_001d5b89;
                }
                lVar10 = lVar10 + 1;
              } while (puVar4[lVar9].n_inc_bases != lVar10);
            }
            _Var3 = flag_is_inter(pmVar1->flags,puVar4[lVar9].inc_flags,0xb);
            wVar8 = wVar8 + (uint)_Var3;
            puVar4 = monster_group;
            wVar6 = n_monster_group;
            if (_Var3) {
              bVar12 = 1;
            }
LAB_001d5b89:
            lVar9 = lVar9 + 1;
          } while (lVar9 < wVar6 + L'\xffffffff');
          uVar7 = (uint)(~bVar12 & 1);
          paVar5 = z_info;
        }
        wVar8 = wVar8 + uVar7;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < paVar5->r_max);
  }
  return wVar8;
}

Assistant:

static int count_known_monsters(void)
{
	int m_count = 0, i;

	for (i = 0; i < z_info->r_max; ++i) {
		struct monster_race *race = &r_info[i];
		bool classified = false;
		int j;

		if (!l_list[i].all_known && !l_list[i].sights) {
			continue;
		}
		if (!race->name) continue;

		for (j = 0; j < n_monster_group - 1; ++j) {
			bool has_base = false;

			if (monster_group[j].n_inc_bases) {
				int k;

				for (k = 0; k < monster_group[j].n_inc_bases;
						++k) {
					if (race->base == monster_group[j].inc_bases[k]) {
						++m_count;
						has_base = true;
						classified = true;
						break;
					}
				}
			}
			if (!has_base && rf_is_inter(race->flags,
					monster_group[j].inc_flags)) {
				++m_count;
				classified = true;
			}
		}

		if (!classified) {
			++m_count;
		}
	}

	return m_count;
}